

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void option::PrintUsageImplementation::indent(IStringWriter *write,int *x,int want_x)

{
  int local_28;
  undefined1 local_21;
  int i;
  int iStack_1c;
  char space;
  int indent;
  int want_x_local;
  int *x_local;
  IStringWriter *write_local;
  
  i = want_x - *x;
  iStack_1c = want_x;
  _indent = x;
  x_local = (int *)write;
  if (i < 0) {
    (**write->_vptr_IStringWriter)(write,"\n",1);
    i = iStack_1c;
  }
  if (0 < i) {
    local_21 = 0x20;
    for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
      (*(code *)**(undefined8 **)x_local)(x_local,&local_21,1);
    }
    *_indent = iStack_1c;
  }
  return;
}

Assistant:

static void indent(IStringWriter& write, int& x, int want_x)
  {
    int indent = want_x - x;
    if (indent < 0)
    {
      write("\n", 1);
      indent = want_x;
    }

    if (indent > 0)
    {
      char space = ' ';
      for (int i = 0; i < indent; ++i)
        write(&space, 1);
      x = want_x;
    }
  }